

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiger.cpp
# Opt level: O2

void __thiscall despot::Tiger::PrintAction(Tiger *this,ACT_TYPE action,ostream *out)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = "Listen";
  if (action == 1) {
    pcVar2 = "Open right";
  }
  pcVar3 = "Open left";
  if (action != 0) {
    pcVar3 = pcVar2;
  }
  poVar1 = std::operator<<(out,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Tiger::PrintAction(ACT_TYPE action, ostream& out) const {
	if (action == LEFT) {
		out << "Open left" << endl;
	} else if (action == RIGHT) {
		out << "Open right" << endl;
	} else {
		out << "Listen" << endl;
	}
}